

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void forward_DCT(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY sample_data,
                JBLOCKROW coef_blocks,JDIMENSION start_row,JDIMENSION start_col,
                JDIMENSION num_blocks)

{
  int iVar1;
  forward_DCT_ptr p_Var2;
  forward_DCT_ptr p_Var3;
  short sVar4;
  ulong uVar5;
  uint uVar6;
  JBLOCKROW paJVar7;
  int iVar8;
  JDIMENSION JVar9;
  ulong uVar10;
  long lVar11;
  DCTELEM workspace [64];
  JDIMENSION in_stack_fffffffffffffeb8;
  
  p_Var2 = cinfo->fdct[1].forward_DCT[(long)compptr->component_index + -1];
  paJVar7 = (JBLOCKROW)(long)compptr->quant_tbl_no;
  p_Var3 = cinfo->fdct[1].forward_DCT[(long)((long)*paJVar7 + 9)];
  uVar5 = (ulong)start_row;
  JVar9 = start_col;
  for (uVar10 = 0; uVar10 != num_blocks; uVar10 = uVar10 + 1) {
    (*p_Var2)((j_compress_ptr)&stack0xfffffffffffffec8,(jpeg_component_info *)(sample_data + uVar5),
              (JSAMPARRAY)(ulong)JVar9,paJVar7,start_row,start_col,in_stack_fffffffffffffeb8);
    for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
      iVar1 = *(int *)(p_Var3 + lVar11 * 4);
      uVar6 = *(uint *)(&stack0xfffffffffffffec8 + lVar11 * 4);
      paJVar7 = (JBLOCKROW)(ulong)uVar6;
      if ((int)uVar6 < 0) {
        iVar8 = (iVar1 >> 1) - uVar6;
        sVar4 = 0;
        if (iVar1 <= iVar8) {
          sVar4 = (short)(iVar8 / iVar1);
        }
        sVar4 = -sVar4;
      }
      else {
        uVar6 = uVar6 + (iVar1 >> 1);
        paJVar7 = (JBLOCKROW)(ulong)uVar6;
        sVar4 = 0;
        if (iVar1 <= (int)uVar6) {
          sVar4 = (short)((int)uVar6 / iVar1);
        }
      }
      (*coef_blocks)[lVar11] = sVar4;
    }
    JVar9 = JVar9 + compptr->DCT_h_scaled_size;
    coef_blocks = coef_blocks + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
forward_DCT (j_compress_ptr cinfo, jpeg_component_info * compptr,
	     JSAMPARRAY sample_data, JBLOCKROW coef_blocks,
	     JDIMENSION start_row, JDIMENSION start_col,
	     JDIMENSION num_blocks)
/* This version is used for integer DCT implementations. */
{
  /* This routine is heavily used, so it's worth coding it tightly. */
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  forward_DCT_method_ptr do_dct = fdct->do_dct[compptr->component_index];
  DCTELEM * divisors = fdct->divisors[compptr->quant_tbl_no];
  DCTELEM workspace[DCTSIZE2];	/* work area for FDCT subroutine */
  JDIMENSION bi;

  sample_data += start_row;	/* fold in the vertical offset once */

  for (bi = 0; bi < num_blocks; bi++, start_col += compptr->DCT_h_scaled_size) {
    /* Perform the DCT */
    (*do_dct) (workspace, sample_data, start_col);

    /* Quantize/descale the coefficients, and store into coef_blocks[] */
    { register DCTELEM temp, qval;
      register int i;
      register JCOEFPTR output_ptr = coef_blocks[bi];

      for (i = 0; i < DCTSIZE2; i++) {
	qval = divisors[i];
	temp = workspace[i];
	/* Divide the coefficient value by qval, ensuring proper rounding.
	 * Since C does not specify the direction of rounding for negative
	 * quotients, we have to force the dividend positive for portability.
	 *
	 * In most files, at least half of the output values will be zero
	 * (at default quantization settings, more like three-quarters...)
	 * so we should ensure that this case is fast.  On many machines,
	 * a comparison is enough cheaper than a divide to make a special test
	 * a win.  Since both inputs will be nonnegative, we need only test
	 * for a < b to discover whether a/b is 0.
	 * If your machine's division is fast enough, define FAST_DIVIDE.
	 */
#ifdef FAST_DIVIDE
#define DIVIDE_BY(a,b)	a /= b
#else
#define DIVIDE_BY(a,b)	if (a >= b) a /= b; else a = 0
#endif
	if (temp < 0) {
	  temp = -temp;
	  temp += qval>>1;	/* for rounding */
	  DIVIDE_BY(temp, qval);
	  temp = -temp;
	} else {
	  temp += qval>>1;	/* for rounding */
	  DIVIDE_BY(temp, qval);
	}
	output_ptr[i] = (JCOEF) temp;
      }
    }
  }
}